

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner-math.c
# Opt level: O3

double ContextToDouble(RunnerContext *context)

{
  uint uVar1;
  
  switch(context->dataType) {
  case BOOLEAN:
    uVar1 = (uint)(context->value).vChar;
    break;
  case BYTE:
    uVar1 = (uint)(context->value).vByte;
    break;
  case SHORT:
    uVar1 = (uint)(context->value).vShort;
    break;
  case INT:
    return (double)(context->value).vInt;
  case FLOAT:
    return (double)(context->value).vFloat;
  case DOUBLE:
    return (context->value).vDouble;
  case LONG:
    return (double)(context->value).vLong;
  default:
    puts("Invalid operator");
    exit(0);
  }
  return (double)(int)uVar1;
}

Assistant:

double ContextToDouble(RunnerContext* context){
  int type = (int) context->dataType;
  switch (type) {
    case BOOLEAN: return (double) context->value.vBoolean;
    case BYTE: return (double) context->value.vByte;
    case SHORT: return (double) context->value.vShort;
    case INT: return (double) context->value.vInt;
    case FLOAT: return (double) context->value.vFloat;
    case DOUBLE: return (double) context->value.vDouble;
    case LONG: return (double) context->value.vLong;
  }

  RUNTIME_ERROR("Invalid operator")
}